

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

QString * __thiscall
CPP::WriteInitialization::disableSorting
          (QString *__return_storage_ptr__,WriteInitialization *this,DomWidget *w,QString *varName)

{
  long lVar1;
  Driver *this_00;
  Data *pDVar2;
  DomItem **ppDVar3;
  Language LVar4;
  QTextStream *pQVar5;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<DomItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  local_58.d = (w->m_item).d.d;
  local_58.ptr = (w->m_item).d.ptr;
  lVar1 = (w->m_item).d.size;
  if (local_58.d != (Data *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58.size = lVar1;
  QArrayDataPointer<DomItem_*>::~QArrayDataPointer(&local_58);
  if (lVar1 != 0) {
    this_00 = this->m_driver;
    latin1.m_data = "__sortingEnabled";
    latin1.m_size = 0x10;
    QString::QString((QString *)&local_70,latin1);
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_88.size = 0;
    Driver::unique((QString *)&local_58,this_00,(QString *)&local_70,(QString *)&local_88);
    pDVar2 = (Data *)(__return_storage_ptr__->d).d;
    ppDVar3 = (DomItem **)(__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)local_58.d;
    (__return_storage_ptr__->d).ptr = (char16_t *)local_58.ptr;
    lVar1 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_58.size;
    local_58.d = pDVar2;
    local_58.ptr = ppDVar3;
    local_58.size = lVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    pQVar5 = &this->m_refreshOut;
    QTextStream::operator<<(pQVar5,"\n");
    QTextStream::operator<<(pQVar5,&this->m_indent);
    LVar4 = language::language();
    if (LVar4 == Cpp) {
      QTextStream::operator<<(pQVar5,"const bool ");
    }
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,__return_storage_ptr__);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5," = ");
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,varName);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)language::derefPointer);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"isSortingEnabled()");
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)language::eol);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,&this->m_indent);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,varName);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)language::derefPointer);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"setSortingEnabled(");
    language::boolValue((QString *)&local_58,false);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_58);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,')');
    QTextStream::operator<<(pQVar5,(QString *)language::eol);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString WriteInitialization::disableSorting(DomWidget *w, const QString &varName)
{
    // turn off sortingEnabled to force programmatic item order (setItem())
    QString tempName;
    if (!w->elementItem().isEmpty()) {
        tempName = m_driver->unique("__sortingEnabled"_L1);
        m_refreshOut << "\n";
        m_refreshOut << m_indent;
        if (language::language() == Language::Cpp)
            m_refreshOut << "const bool ";
        m_refreshOut << tempName << " = " << varName << language::derefPointer
            << "isSortingEnabled()" << language::eol
            << m_indent << varName << language::derefPointer
            << "setSortingEnabled(" << language::boolValue(false) << ')' << language::eol;
    }
    return tempName;
}